

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat4 * dja::operator*(mat4 *__return_storage_ptr__,mat4 *a,mat4 *b)

{
  vec4 *pvVar1;
  vec4 *b_00;
  float_t *pfVar2;
  float_t fVar3;
  int local_60;
  int local_5c;
  int i;
  int j;
  mat4 t;
  mat4 *b_local;
  mat4 *a_local;
  
  t.m[3]._8_8_ = b;
  transpose((mat4 *)&i,b);
  mat4::mat4(__return_storage_ptr__,1.0);
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
      pvVar1 = mat4::operator[](a,local_5c);
      b_00 = mat4::operator[]((mat4 *)&i,local_60);
      fVar3 = dot(pvVar1,b_00);
      pvVar1 = mat4::operator[](__return_storage_ptr__,local_5c);
      pfVar2 = vec4::operator[](pvVar1,local_60);
      *pfVar2 = fVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

mat4 operator*(const mat4& a, const mat4& b)
{
    mat4 t = transpose(b), r;

    for (int j = 0; j < 4; ++j)
    for (int i = 0; i < 4; ++i)
        r[j][i] = dot(a[j], t[i]);

    return r;
}